

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

size_t phosg::skip_word(char *s,size_t offset)

{
  while ((0x20 < (ulong)(byte)s[offset] ||
         ((0x100002601U >> ((ulong)(byte)s[offset] & 0x3f) & 1) == 0))) {
    offset = offset + 1;
  }
  while (((*s != '\0' && ((ulong)(byte)s[offset] < 0x21)) &&
         ((0x100002600U >> ((ulong)(byte)s[offset] & 0x3f) & 1) != 0))) {
    offset = offset + 1;
  }
  return offset;
}

Assistant:

size_t skip_word(const char* s, size_t offset) {
  return skip_whitespace(s, skip_non_whitespace(s, offset));
}